

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# method.cc
# Opt level: O0

void __thiscall iqxmlrpc::Server_feedback::set_exit_flag(Server_feedback *this)

{
  Exception *this_00;
  allocator<char> local_31;
  string local_30;
  Server_feedback *local_10;
  Server_feedback *this_local;
  
  local_10 = this;
  if (this->server_ == (Server *)0x0) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Server_feedback: null pointer access.",&local_31);
    Exception::Exception(this_00,&local_30,-32000);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  Server::set_exit_flag(this->server_);
  return;
}

Assistant:

void Server_feedback::set_exit_flag()
{
  if (!server_) // should never be
    throw Exception("Server_feedback: null pointer access.");

  server_->set_exit_flag();
}